

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MapFieldGenerator::GeneratePrivateMembers
          (MapFieldGenerator *this,Printer *printer)

{
  char *text;
  
  if ((((this->super_FieldGenerator).options_)->enforce_lite == false) &&
     (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa8) != 3)) {
    text = 
    "public:\nclass $map_classname$ : public ::google::protobuf::internal::MapEntry<$map_classname$, \n    $key_cpp$, $val_cpp$,\n    $key_wire_type$,\n    $val_wire_type$,\n    $default_enum_value$ > {\npublic:\n  typedef ::google::protobuf::internal::MapEntry<$map_classname$, \n    $key_cpp$, $val_cpp$,\n    $key_wire_type$,\n    $val_wire_type$,\n    $default_enum_value$ > SuperType;\n  $map_classname$();\n  $map_classname$(::google::protobuf::Arena* arena);\n  void MergeFrom(const ::google::protobuf::Message& other) PROTOBUF_FINAL;\n  void MergeFrom(const $map_classname$& other);\n  static const Message* internal_default_instance() { return reinterpret_cast<const Message*>(&_$map_classname$_default_instance_); }\n  ::google::protobuf::Metadata GetMetadata() const;\n};\n"
    ;
  }
  else {
    text = 
    "public:\ntypedef ::google::protobuf::internal::MapEntryLite<\n    $key_cpp$, $val_cpp$,\n    $key_wire_type$,\n    $val_wire_type$,\n    $default_enum_value$ >\n    $map_classname$;\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  io::Printer::Print(printer,&this->variables_,
                     "::google::protobuf::internal::MapField$lite$<\n    $map_classname$,\n    $key_cpp$, $val_cpp$,\n    $key_wire_type$,\n    $val_wire_type$,\n    $default_enum_value$ > $name$_;\nprivate:\n"
                    );
  return;
}

Assistant:

void MapFieldGenerator::
GeneratePrivateMembers(io::Printer* printer) const {
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    printer->Print(
        variables_,
        "public:\n"
        "class $map_classname$ : public "
        "::google::protobuf::internal::MapEntry<$map_classname$, \n"
        "    $key_cpp$, $val_cpp$,\n"
        "    $key_wire_type$,\n"
        "    $val_wire_type$,\n"
        "    $default_enum_value$ > {\n"
        "public:\n"
        "  typedef ::google::protobuf::internal::MapEntry<$map_classname$, \n"
        "    $key_cpp$, $val_cpp$,\n"
        "    $key_wire_type$,\n"
        "    $val_wire_type$,\n"
        "    $default_enum_value$ > SuperType;\n"
        "  $map_classname$();\n"
        "  $map_classname$(::google::protobuf::Arena* arena);\n"
        "  void MergeFrom(const ::google::protobuf::Message& other) PROTOBUF_FINAL;\n"
        "  void MergeFrom(const $map_classname$& other);\n"
        "  static const Message* internal_default_instance() { return "
        "reinterpret_cast<const "
        "Message*>(&_$map_classname$_default_instance_); }\n"
        "  ::google::protobuf::Metadata GetMetadata() const;\n"
        "};\n");
  } else {
    printer->Print(variables_,
                   "public:\n"
                   "typedef ::google::protobuf::internal::MapEntryLite<\n"
                   "    $key_cpp$, $val_cpp$,\n"
                   "    $key_wire_type$,\n"
                   "    $val_wire_type$,\n"
                   "    $default_enum_value$ >\n"
                   "    $map_classname$;\n");
  }
  printer->Print(variables_,
                 "::google::protobuf::internal::MapField$lite$<\n"
                 "    $map_classname$,\n"
                 "    $key_cpp$, $val_cpp$,\n"
                 "    $key_wire_type$,\n"
                 "    $val_wire_type$,\n"
                 "    $default_enum_value$ > $name$_;\n"
                 "private:\n");
}